

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libjsonnet.cpp
# Opt level: O0

JsonnetJsonValue * jsonnet_json_make_number(JsonnetVm *vm,double v)

{
  JsonnetJsonValue *this;
  double in_XMM0_Qa;
  JsonnetJsonValue *r;
  
  this = (JsonnetJsonValue *)operator_new(0x78);
  memset(this,0,0x78);
  JsonnetJsonValue::JsonnetJsonValue(this);
  this->kind = NUMBER;
  this->number = in_XMM0_Qa;
  return this;
}

Assistant:

JsonnetJsonValue *jsonnet_json_make_number(struct JsonnetVm *vm, double v)
{
    (void)vm;
    JsonnetJsonValue *r = new JsonnetJsonValue();
    r->kind = JsonnetJsonValue::NUMBER;
    r->number = v;
    return r;
}